

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::absheaptype<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx,Shareability share)

{
  Lexer *pLVar1;
  bool bVar2;
  allocator<char> local_1c9;
  string local_1c8;
  Err local_1a8;
  Ok local_181;
  basic_string_view<char,_std::char_traits<char>_> local_180;
  Ok local_169;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  Ok local_151;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  Ok local_139;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  Ok local_121;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  Ok local_109;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  Ok local_f1;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  Ok local_d9;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  Ok local_c1;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  Ok local_a9;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  Ok local_91;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  Ok local_79;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  Ok local_61;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  Ok local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  Ok local_31;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  Shareability local_1c;
  Lexer *pLStack_18;
  Shareability share_local;
  NullCtx *ctx_local;
  
  local_1c = share;
  pLStack_18 = &ctx->in;
  ctx_local = (NullCtx *)__return_storage_ptr__;
  local_30 = sv("func",4);
  bVar2 = Lexer::takeKeyword(&ctx->in,local_30);
  pLVar1 = pLStack_18;
  if (bVar2) {
    NullTypeParserCtx::makeFuncType((NullTypeParserCtx *)pLStack_18,local_1c);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_31);
  }
  else {
    local_48 = sv("any",3);
    bVar2 = Lexer::takeKeyword(pLVar1,local_48);
    pLVar1 = pLStack_18;
    if (bVar2) {
      NullTypeParserCtx::makeAnyType((NullTypeParserCtx *)pLStack_18,local_1c);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_49);
    }
    else {
      local_60 = sv("extern",6);
      bVar2 = Lexer::takeKeyword(pLVar1,local_60);
      pLVar1 = pLStack_18;
      if (bVar2) {
        NullTypeParserCtx::makeExternType((NullTypeParserCtx *)pLStack_18,local_1c);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_61);
      }
      else {
        local_78 = sv("eq",2);
        bVar2 = Lexer::takeKeyword(pLVar1,local_78);
        pLVar1 = pLStack_18;
        if (bVar2) {
          NullTypeParserCtx::makeEqType((NullTypeParserCtx *)pLStack_18,local_1c);
          Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_79);
        }
        else {
          local_90 = sv("i31",3);
          bVar2 = Lexer::takeKeyword(pLVar1,local_90);
          pLVar1 = pLStack_18;
          if (bVar2) {
            NullTypeParserCtx::makeI31Type((NullTypeParserCtx *)pLStack_18,local_1c);
            Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_91);
          }
          else {
            local_a8 = sv("struct",6);
            bVar2 = Lexer::takeKeyword(pLVar1,local_a8);
            pLVar1 = pLStack_18;
            if (bVar2) {
              NullTypeParserCtx::makeStructType((NullTypeParserCtx *)pLStack_18,local_1c);
              Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_a9);
            }
            else {
              local_c0 = sv("array",5);
              bVar2 = Lexer::takeKeyword(pLVar1,local_c0);
              pLVar1 = pLStack_18;
              if (bVar2) {
                NullTypeParserCtx::makeArrayType((NullTypeParserCtx *)pLStack_18,local_1c);
                Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_c1);
              }
              else {
                local_d8 = sv("exn",3);
                bVar2 = Lexer::takeKeyword(pLVar1,local_d8);
                pLVar1 = pLStack_18;
                if (bVar2) {
                  NullTypeParserCtx::makeExnType((NullTypeParserCtx *)pLStack_18,local_1c);
                  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d9);
                }
                else {
                  local_f0 = sv("string",6);
                  bVar2 = Lexer::takeKeyword(pLVar1,local_f0);
                  pLVar1 = pLStack_18;
                  if (bVar2) {
                    NullTypeParserCtx::makeStringType((NullTypeParserCtx *)pLStack_18,local_1c);
                    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_f1);
                  }
                  else {
                    local_108 = sv("cont",4);
                    bVar2 = Lexer::takeKeyword(pLVar1,local_108);
                    pLVar1 = pLStack_18;
                    if (bVar2) {
                      NullTypeParserCtx::makeContType((NullTypeParserCtx *)pLStack_18,local_1c);
                      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_109);
                    }
                    else {
                      local_120 = sv("none",4);
                      bVar2 = Lexer::takeKeyword(pLVar1,local_120);
                      pLVar1 = pLStack_18;
                      if (bVar2) {
                        NullTypeParserCtx::makeNoneType((NullTypeParserCtx *)pLStack_18,local_1c);
                        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_121);
                      }
                      else {
                        local_138 = sv("noextern",8);
                        bVar2 = Lexer::takeKeyword(pLVar1,local_138);
                        pLVar1 = pLStack_18;
                        if (bVar2) {
                          NullTypeParserCtx::makeNoextType((NullTypeParserCtx *)pLStack_18,local_1c)
                          ;
                          Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_139);
                        }
                        else {
                          local_150 = sv("nofunc",6);
                          bVar2 = Lexer::takeKeyword(pLVar1,local_150);
                          pLVar1 = pLStack_18;
                          if (bVar2) {
                            NullTypeParserCtx::makeNofuncType
                                      ((NullTypeParserCtx *)pLStack_18,local_1c);
                            Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_151);
                          }
                          else {
                            local_168 = sv("noexn",5);
                            bVar2 = Lexer::takeKeyword(pLVar1,local_168);
                            pLVar1 = pLStack_18;
                            if (bVar2) {
                              NullTypeParserCtx::makeNoexnType
                                        ((NullTypeParserCtx *)pLStack_18,local_1c);
                              Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_169);
                            }
                            else {
                              local_180 = sv("nocont",6);
                              bVar2 = Lexer::takeKeyword(pLVar1,local_180);
                              pLVar1 = pLStack_18;
                              if (bVar2) {
                                NullTypeParserCtx::makeNocontType
                                          ((NullTypeParserCtx *)pLStack_18,local_1c);
                                Result<wasm::Ok>::Result<wasm::Ok>
                                          (__return_storage_ptr__,&local_181);
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_1c8,"expected abstract heap type",
                                           &local_1c9);
                                Lexer::err(&local_1a8,pLVar1,&local_1c8);
                                Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1a8);
                                wasm::Err::~Err(&local_1a8);
                                std::__cxx11::string::~string((string *)&local_1c8);
                                std::allocator<char>::~allocator(&local_1c9);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> absheaptype(Ctx& ctx, Shareability share) {
  if (ctx.in.takeKeyword("func"sv)) {
    return ctx.makeFuncType(share);
  }
  if (ctx.in.takeKeyword("any"sv)) {
    return ctx.makeAnyType(share);
  }
  if (ctx.in.takeKeyword("extern"sv)) {
    return ctx.makeExternType(share);
  }
  if (ctx.in.takeKeyword("eq"sv)) {
    return ctx.makeEqType(share);
  }
  if (ctx.in.takeKeyword("i31"sv)) {
    return ctx.makeI31Type(share);
  }
  if (ctx.in.takeKeyword("struct"sv)) {
    return ctx.makeStructType(share);
  }
  if (ctx.in.takeKeyword("array"sv)) {
    return ctx.makeArrayType(share);
  }
  if (ctx.in.takeKeyword("exn"sv)) {
    return ctx.makeExnType(share);
  }
  if (ctx.in.takeKeyword("string"sv)) {
    return ctx.makeStringType(share);
  }
  if (ctx.in.takeKeyword("cont"sv)) {
    return ctx.makeContType(share);
  }
  if (ctx.in.takeKeyword("none"sv)) {
    return ctx.makeNoneType(share);
  }
  if (ctx.in.takeKeyword("noextern"sv)) {
    return ctx.makeNoextType(share);
  }
  if (ctx.in.takeKeyword("nofunc"sv)) {
    return ctx.makeNofuncType(share);
  }
  if (ctx.in.takeKeyword("noexn"sv)) {
    return ctx.makeNoexnType(share);
  }
  if (ctx.in.takeKeyword("nocont"sv)) {
    return ctx.makeNocontType(share);
  }
  return ctx.in.err("expected abstract heap type");
}